

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar_vector.hpp
# Opt level: O2

void __thiscall
cfgfile::
tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::on_string(tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
            *this,parser_info_t<cfgfile::string_trait_t> *info,string_t *str)

{
  constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcVar1;
  bool bVar2;
  int iVar3;
  exception_t<cfgfile::string_trait_t> *peVar4;
  allocator local_2cd;
  allocator local_2cc;
  allocator local_2cb;
  allocator local_2ca;
  allocator local_2c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  allocator local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar2 = tag_t<cfgfile::string_trait_t>::is_any_child_defined
                    (&this->super_tag_t<cfgfile::string_trait_t>);
  if (bVar2) {
    peVar4 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_188,"Value \"",local_88);
    std::__cxx11::string::string((string *)&local_168,(string *)&local_188);
    std::operator+(&local_148,&local_168,str);
    std::__cxx11::string::string((string *)&local_1c8,"\" for tag \"",&local_2ca);
    std::__cxx11::string::string((string *)&local_1a8,(string *)&local_1c8);
    std::operator+(&local_128,&local_148,&local_1a8);
    std::operator+(&local_108,&local_128,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
    std::__cxx11::string::string
              ((string *)&local_208,"\" must be defined before any child tag. In file \"",&local_2cb
              );
    std::__cxx11::string::string((string *)&local_1e8,(string *)&local_208);
    std::operator+(&local_e8,&local_108,&local_1e8);
    std::operator+(&local_c8,&local_e8,&info->m_file_name);
    std::__cxx11::string::string((string *)&local_248,"\" on line ",&local_2cc);
    std::__cxx11::string::string((string *)&local_228,(string *)&local_248);
    std::operator+(&local_a8,&local_c8,&local_228);
    std::__cxx11::to_string(&local_268,info->m_line_number);
    std::operator+(&value,&local_a8,&local_268);
    std::__cxx11::string::string((string *)&local_2a8,".",&local_2cd);
    std::__cxx11::string::string((string *)&local_288,(string *)&local_2a8);
    std::operator+(&local_48,&value,&local_288);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar4,&local_48);
    __cxa_throw(peVar4,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  std::__cxx11::string::string((string *)&value,(string *)str);
  pcVar1 = this->m_constraint;
  if (pcVar1 != (constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    iVar3 = (*pcVar1->_vptr_constraint_t[2])(pcVar1,&value);
    if ((char)iVar3 == '\0') {
      peVar4 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&local_1a8,"Invalid value: \"",&local_2ca);
      std::__cxx11::string::string((string *)&local_188,(string *)&local_1a8);
      std::operator+(&local_168,&local_188,str);
      std::__cxx11::string::string
                ((string *)&local_1e8,"\". Value must match to the constraint in tag \"",&local_2cb)
      ;
      std::__cxx11::string::string((string *)&local_1c8,(string *)&local_1e8);
      std::operator+(&local_148,&local_168,&local_1c8);
      std::operator+(&local_128,&local_148,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
      std::__cxx11::string::string((string *)&local_228,"\". In file \"",&local_2cc);
      std::__cxx11::string::string((string *)&local_208,(string *)&local_228);
      std::operator+(&local_108,&local_128,&local_208);
      std::operator+(&local_e8,&local_108,&info->m_file_name);
      std::__cxx11::string::string((string *)&local_268,"\" on line ",&local_2cd);
      std::__cxx11::string::string((string *)&local_248,(string *)&local_268);
      std::operator+(&local_c8,&local_e8,&local_248);
      std::__cxx11::to_string(&local_288,info->m_line_number);
      std::operator+(&local_a8,&local_c8,&local_288);
      std::__cxx11::string::string((string *)local_88,".",&local_2c9);
      std::__cxx11::string::string((string *)&local_2a8,(string *)local_88);
      std::operator+(&local_68,&local_a8,&local_2a8);
      exception_t<cfgfile::string_trait_t>::exception_t(peVar4,&local_68);
      __cxa_throw(peVar4,&exception_t<cfgfile::string_trait_t>::typeinfo,
                  exception_t<cfgfile::string_trait_t>::~exception_t);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_values,&value);
  (this->super_tag_t<cfgfile::string_trait_t>).m_is_defined = true;
  std::__cxx11::string::~string((string *)&value);
  return;
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		if( this->is_any_child_defined() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Value \"" ) + str +
				Trait::from_ascii( "\" for tag \"" ) + this->name() +
				Trait::from_ascii( "\" must be defined before any child "
					"tag. In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		const T value = format_t< T, Trait >::from_string( info, str );

		if( m_constraint )
		{
			if( !m_constraint->check( value ) )
				throw exception_t< Trait >(
					Trait::from_ascii( "Invalid value: \"" ) +
					str + Trait::from_ascii( "\". Value must match to the "
						"constraint in tag \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}

		m_values.push_back( value );

		this->set_defined();
	}